

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_object_brand(parser *p)

{
  byte bVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  void *pvVar5;
  uint uVar6;
  brand_conflict *pbVar7;
  ulong uVar8;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getstr(p,"code");
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    bVar1 = z_info->brand_max;
    uVar6 = 1;
    if (1 < bVar1) {
      uVar6 = (uint)bVar1;
    }
    pbVar7 = brands;
    for (uVar8 = 1; pbVar7 = pbVar7 + 1, uVar8 < bVar1; uVar8 = uVar8 + 1) {
      iVar2 = strcmp(__s1,pbVar7->code);
      if (iVar2 == 0) {
        uVar6 = (uint)uVar8;
        break;
      }
    }
    if (uVar6 == bVar1) {
      pVar3 = PARSE_ERROR_UNRECOGNISED_BRAND;
    }
    else {
      pvVar5 = *(void **)((long)pvVar4 + 0x210);
      if (pvVar5 == (void *)0x0) {
        pvVar5 = mem_zalloc((ulong)(uint)bVar1);
        *(void **)((long)pvVar4 + 0x210) = pvVar5;
      }
      *(undefined1 *)((long)pvVar5 + (ulong)uVar6) = 1;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_object_brand(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	const char *s = parser_getstr(p, "code");
	int i;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->brand_max; i++) {
		if (streq(s, brands[i].code)) break;
	}
	if (i == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	if (!k->brands) {
		k->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	}
	k->brands[i] = true;
	return PARSE_ERROR_NONE;
}